

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void PlanarTo24b_SSE2(__m128i *in0,__m128i *in1,__m128i *in2,__m128i *in3,__m128i *in4,__m128i *in5,
                     uint8_t *rgb)

{
  __m128i alVar1;
  __m128i alVar2;
  __m128i alVar3;
  __m128i alVar4;
  __m128i alVar5;
  byte bVar6;
  byte bVar14;
  byte bVar22;
  byte bVar30;
  byte bVar38;
  byte bVar46;
  byte bVar54;
  char cVar59;
  byte bVar62;
  byte bVar70;
  byte bVar78;
  short sVar79;
  short sVar80;
  short sVar81;
  short sVar82;
  short sVar83;
  short sVar84;
  short sVar85;
  short sVar86;
  short sVar87;
  short sVar88;
  short sVar89;
  short sVar90;
  short sVar91;
  short sVar92;
  short sVar93;
  short sVar94;
  longlong lVar95;
  undefined1 auVar96 [16];
  undefined4 uVar97;
  undefined1 auVar101 [12];
  undefined1 auVar102 [12];
  undefined1 auVar106 [16];
  ushort uVar108;
  ushort uVar119;
  undefined4 uVar109;
  ushort uVar120;
  ushort uVar121;
  ushort uVar122;
  ushort uVar123;
  undefined1 auVar113 [12];
  undefined1 auVar114 [12];
  ushort uVar124;
  ushort uVar125;
  undefined4 uVar126;
  undefined1 auVar130 [12];
  undefined1 auVar131 [12];
  undefined1 auVar135 [16];
  undefined4 uVar139;
  undefined1 auVar143 [12];
  undefined1 auVar144 [12];
  undefined4 uVar151;
  undefined1 auVar155 [12];
  undefined4 uVar160;
  undefined1 auVar164 [12];
  ushort uVar169;
  undefined4 uVar170;
  ushort uVar177;
  ushort uVar178;
  ushort uVar179;
  ushort uVar180;
  ushort uVar181;
  ushort uVar182;
  ushort uVar183;
  undefined1 auVar175 [16];
  undefined4 uVar184;
  undefined1 auVar189 [16];
  undefined4 uVar191;
  char cVar7;
  char cVar8;
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  char cVar28;
  char cVar29;
  char cVar31;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar39;
  char cVar40;
  char cVar41;
  char cVar42;
  char cVar43;
  char cVar44;
  char cVar45;
  char cVar47;
  char cVar48;
  char cVar49;
  char cVar50;
  char cVar51;
  char cVar52;
  char cVar53;
  char cVar55;
  char cVar56;
  char cVar57;
  char cVar58;
  char cVar60;
  char cVar61;
  char cVar63;
  char cVar64;
  char cVar65;
  char cVar66;
  char cVar67;
  char cVar68;
  char cVar69;
  char cVar71;
  char cVar72;
  char cVar73;
  char cVar74;
  char cVar75;
  char cVar76;
  char cVar77;
  undefined6 uVar98;
  undefined8 uVar99;
  undefined1 auVar100 [12];
  undefined1 auVar103 [14];
  undefined1 auVar104 [14];
  undefined1 auVar105 [14];
  __m128i alVar107;
  undefined6 uVar110;
  undefined8 uVar111;
  undefined1 auVar112 [12];
  undefined1 auVar115 [14];
  undefined1 auVar116 [14];
  undefined1 auVar117 [14];
  undefined1 auVar118 [16];
  undefined6 uVar127;
  undefined8 uVar128;
  undefined1 auVar129 [12];
  undefined1 auVar132 [14];
  undefined1 auVar133 [14];
  undefined1 auVar134 [14];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined6 uVar140;
  undefined8 uVar141;
  undefined1 auVar142 [12];
  undefined1 auVar145 [14];
  undefined1 auVar146 [14];
  undefined1 auVar147 [14];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined6 uVar152;
  undefined8 uVar153;
  undefined1 auVar154 [12];
  undefined1 auVar156 [14];
  undefined1 auVar157 [14];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined6 uVar161;
  undefined8 uVar162;
  undefined1 auVar163 [12];
  undefined1 auVar165 [14];
  undefined1 auVar166 [14];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined6 uVar171;
  undefined8 uVar172;
  undefined1 auVar173 [12];
  undefined1 auVar174 [14];
  undefined1 auVar176 [16];
  undefined6 uVar185;
  undefined8 uVar186;
  undefined1 auVar187 [12];
  undefined1 auVar188 [14];
  undefined1 auVar190 [16];
  undefined6 uVar192;
  undefined8 uVar193;
  undefined1 auVar194 [12];
  undefined1 auVar195 [14];
  undefined1 auVar196 [16];
  
  auVar96 = _DAT_00123c80;
  alVar1 = *in0;
  alVar2 = *in1;
  auVar135 = (undefined1  [16])alVar1 & _DAT_00123c80;
  auVar106 = (undefined1  [16])alVar2 & _DAT_00123c80;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  bVar6 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  sVar80 = auVar135._4_2_;
  sVar81 = auVar135._6_2_;
  cVar7 = (0 < sVar81) * (sVar81 < 0x100) * auVar135[6] - (0xff < sVar81);
  uVar126 = CONCAT13(cVar7,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar135[4] - (0xff < sVar80),
                                    CONCAT11(bVar6,(0 < sVar79) * (sVar79 < 0x100) * auVar135[0] -
                                                   (0xff < sVar79))));
  sVar79 = auVar135._8_2_;
  sVar80 = auVar135._10_2_;
  cVar8 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[10] - (0xff < sVar80);
  uVar127 = CONCAT15(cVar8,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar135[8] - (0xff < sVar79),
                                    uVar126));
  sVar79 = auVar135._12_2_;
  sVar80 = auVar135._14_2_;
  cVar9 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[0xe] - (0xff < sVar80);
  uVar128 = CONCAT17(cVar9,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar135[0xc] -
                                    (0xff < sVar79),uVar127));
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  cVar10 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  auVar129._0_10_ =
       CONCAT19(cVar10,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79),
                                uVar128));
  sVar79 = auVar106._4_2_;
  auVar129[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[4] - (0xff < sVar79);
  sVar79 = auVar106._6_2_;
  cVar11 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[6] - (0xff < sVar79);
  auVar129[0xb] = cVar11;
  sVar79 = auVar106._8_2_;
  auVar132[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79);
  auVar132._0_12_ = auVar129;
  sVar79 = auVar106._10_2_;
  cVar12 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[10] - (0xff < sVar79);
  auVar132[0xd] = cVar12;
  sVar79 = auVar106._12_2_;
  auVar136[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] - (0xff < sVar79);
  auVar136._0_14_ = auVar132;
  sVar79 = auVar106._14_2_;
  cVar13 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xe] - (0xff < sVar79);
  auVar136[0xf] = cVar13;
  alVar3 = *in2;
  alVar4 = *in3;
  auVar135 = (undefined1  [16])alVar3 & _DAT_00123c80;
  auVar106 = (undefined1  [16])alVar4 & _DAT_00123c80;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  bVar14 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  sVar80 = auVar135._4_2_;
  sVar81 = auVar135._6_2_;
  cVar15 = (0 < sVar81) * (sVar81 < 0x100) * auVar135[6] - (0xff < sVar81);
  uVar151 = CONCAT13(cVar15,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar135[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar14,(0 < sVar79) * (sVar79 < 0x100) * auVar135[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar135._8_2_;
  sVar80 = auVar135._10_2_;
  cVar16 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[10] - (0xff < sVar80);
  uVar152 = CONCAT15(cVar16,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar135[8] - (0xff < sVar79)
                                     ,uVar151));
  sVar79 = auVar135._12_2_;
  sVar80 = auVar135._14_2_;
  cVar17 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[0xe] - (0xff < sVar80);
  uVar153 = CONCAT17(cVar17,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar135[0xc] -
                                     (0xff < sVar79),uVar152));
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  cVar18 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  auVar154._0_10_ =
       CONCAT19(cVar18,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79),
                                uVar153));
  sVar79 = auVar106._4_2_;
  auVar154[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[4] - (0xff < sVar79);
  sVar79 = auVar106._6_2_;
  cVar19 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[6] - (0xff < sVar79);
  auVar154[0xb] = cVar19;
  sVar79 = auVar106._8_2_;
  auVar156[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79);
  auVar156._0_12_ = auVar154;
  sVar79 = auVar106._10_2_;
  cVar20 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[10] - (0xff < sVar79);
  auVar156[0xd] = cVar20;
  sVar79 = auVar106._12_2_;
  auVar158[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] - (0xff < sVar79);
  auVar158._0_14_ = auVar156;
  sVar79 = auVar106._14_2_;
  cVar21 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xe] - (0xff < sVar79);
  auVar158[0xf] = cVar21;
  alVar5 = *in4;
  alVar107 = *in5;
  auVar106 = (undefined1  [16])alVar5 & _DAT_00123c80;
  auVar135 = (undefined1  [16])alVar107 & _DAT_00123c80;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  bVar22 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  sVar80 = auVar106._4_2_;
  sVar81 = auVar106._6_2_;
  cVar23 = (0 < sVar81) * (sVar81 < 0x100) * auVar106[6] - (0xff < sVar81);
  uVar160 = CONCAT13(cVar23,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar106[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar22,(0 < sVar79) * (sVar79 < 0x100) * auVar106[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar106._8_2_;
  sVar80 = auVar106._10_2_;
  cVar24 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[10] - (0xff < sVar80);
  uVar161 = CONCAT15(cVar24,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79)
                                     ,uVar160));
  sVar79 = auVar106._12_2_;
  sVar80 = auVar106._14_2_;
  cVar25 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[0xe] - (0xff < sVar80);
  uVar162 = CONCAT17(cVar25,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] -
                                     (0xff < sVar79),uVar161));
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  cVar26 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  auVar163._0_10_ =
       CONCAT19(cVar26,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar135[0] - (0xff < sVar79),
                                uVar162));
  sVar79 = auVar135._4_2_;
  auVar163[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar135[4] - (0xff < sVar79);
  sVar79 = auVar135._6_2_;
  cVar27 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[6] - (0xff < sVar79);
  auVar163[0xb] = cVar27;
  sVar79 = auVar135._8_2_;
  auVar165[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar135[8] - (0xff < sVar79);
  auVar165._0_12_ = auVar163;
  sVar79 = auVar135._10_2_;
  cVar28 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[10] - (0xff < sVar79);
  auVar165[0xd] = cVar28;
  sVar79 = auVar135._12_2_;
  auVar167[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0xc] - (0xff < sVar79);
  auVar167._0_14_ = auVar165;
  sVar79 = auVar135._14_2_;
  cVar29 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0xe] - (0xff < sVar79);
  auVar167[0xf] = cVar29;
  uVar108 = (ushort)alVar1[0] >> 8;
  uVar119 = alVar1[0]._2_2_ >> 8;
  uVar120 = alVar1[0]._4_2_ >> 8;
  uVar121 = alVar1[0]._6_2_ >> 8;
  uVar122 = (ushort)alVar1[1] >> 8;
  uVar123 = alVar1[1]._2_2_ >> 8;
  uVar124 = alVar1[1]._4_2_ >> 8;
  uVar125 = alVar1[1]._6_2_ >> 8;
  uVar169 = (ushort)alVar2[0] >> 8;
  uVar177 = alVar2[0]._2_2_ >> 8;
  uVar178 = alVar2[0]._4_2_ >> 8;
  uVar179 = alVar2[0]._6_2_ >> 8;
  uVar180 = (ushort)alVar2[1] >> 8;
  uVar181 = alVar2[1]._2_2_ >> 8;
  uVar182 = alVar2[1]._4_2_ >> 8;
  uVar183 = alVar2[1]._6_2_ >> 8;
  bVar30 = (uVar119 != 0) * (uVar119 < 0x100) * alVar1[0]._3_1_ - (0xff < uVar119);
  cVar31 = (uVar121 != 0) * (uVar121 < 0x100) * alVar1[0]._7_1_ - (0xff < uVar121);
  uVar109 = CONCAT13(cVar31,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * alVar1[0]._5_1_ -
                                     (0xff < uVar120),
                                     CONCAT11(bVar30,(uVar108 != 0) * (uVar108 < 0x100) *
                                                     alVar1[0]._1_1_ - (0xff < uVar108))));
  cVar32 = (uVar123 != 0) * (uVar123 < 0x100) * alVar1[1]._3_1_ - (0xff < uVar123);
  uVar110 = CONCAT15(cVar32,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * alVar1[1]._1_1_ -
                                     (0xff < uVar122),uVar109));
  cVar33 = (uVar125 != 0) * (uVar125 < 0x100) * alVar1[1]._7_1_ - (0xff < uVar125);
  uVar111 = CONCAT17(cVar33,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * alVar1[1]._5_1_ -
                                     (0xff < uVar124),uVar110));
  cVar34 = (uVar177 != 0) * (uVar177 < 0x100) * alVar2[0]._3_1_ - (0xff < uVar177);
  auVar112._0_10_ =
       CONCAT19(cVar34,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * alVar2[0]._1_1_ -
                                (0xff < uVar169),uVar111));
  auVar112[10] = (uVar178 != 0) * (uVar178 < 0x100) * alVar2[0]._5_1_ - (0xff < uVar178);
  cVar35 = (uVar179 != 0) * (uVar179 < 0x100) * alVar2[0]._7_1_ - (0xff < uVar179);
  auVar112[0xb] = cVar35;
  auVar115[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * alVar2[1]._1_1_ - (0xff < uVar180);
  auVar115._0_12_ = auVar112;
  cVar36 = (uVar181 != 0) * (uVar181 < 0x100) * alVar2[1]._3_1_ - (0xff < uVar181);
  auVar115[0xd] = cVar36;
  auVar175[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * alVar2[1]._5_1_ - (0xff < uVar182);
  auVar175._0_14_ = auVar115;
  cVar37 = (uVar183 != 0) * (uVar183 < 0x100) * alVar2[1]._7_1_ - (0xff < uVar183);
  auVar175[0xf] = cVar37;
  uVar108 = (ushort)alVar3[0] >> 8;
  uVar119 = alVar3[0]._2_2_ >> 8;
  uVar120 = alVar3[0]._4_2_ >> 8;
  uVar121 = alVar3[0]._6_2_ >> 8;
  uVar122 = (ushort)alVar3[1] >> 8;
  uVar123 = alVar3[1]._2_2_ >> 8;
  uVar124 = alVar3[1]._4_2_ >> 8;
  uVar125 = alVar3[1]._6_2_ >> 8;
  uVar169 = (ushort)alVar4[0] >> 8;
  uVar177 = alVar4[0]._2_2_ >> 8;
  uVar178 = alVar4[0]._4_2_ >> 8;
  uVar179 = alVar4[0]._6_2_ >> 8;
  uVar180 = (ushort)alVar4[1] >> 8;
  uVar181 = alVar4[1]._2_2_ >> 8;
  uVar182 = alVar4[1]._4_2_ >> 8;
  uVar183 = alVar4[1]._6_2_ >> 8;
  bVar38 = (uVar119 != 0) * (uVar119 < 0x100) * alVar3[0]._3_1_ - (0xff < uVar119);
  cVar39 = (uVar121 != 0) * (uVar121 < 0x100) * alVar3[0]._7_1_ - (0xff < uVar121);
  uVar97 = CONCAT13(cVar39,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * alVar3[0]._5_1_ -
                                    (0xff < uVar120),
                                    CONCAT11(bVar38,(uVar108 != 0) * (uVar108 < 0x100) *
                                                    alVar3[0]._1_1_ - (0xff < uVar108))));
  cVar40 = (uVar123 != 0) * (uVar123 < 0x100) * alVar3[1]._3_1_ - (0xff < uVar123);
  uVar98 = CONCAT15(cVar40,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * alVar3[1]._1_1_ -
                                    (0xff < uVar122),uVar97));
  cVar41 = (uVar125 != 0) * (uVar125 < 0x100) * alVar3[1]._7_1_ - (0xff < uVar125);
  uVar99 = CONCAT17(cVar41,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * alVar3[1]._5_1_ -
                                    (0xff < uVar124),uVar98));
  cVar42 = (uVar177 != 0) * (uVar177 < 0x100) * alVar4[0]._3_1_ - (0xff < uVar177);
  auVar100._0_10_ =
       CONCAT19(cVar42,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * alVar4[0]._1_1_ -
                                (0xff < uVar169),uVar99));
  auVar100[10] = (uVar178 != 0) * (uVar178 < 0x100) * alVar4[0]._5_1_ - (0xff < uVar178);
  cVar43 = (uVar179 != 0) * (uVar179 < 0x100) * alVar4[0]._7_1_ - (0xff < uVar179);
  auVar100[0xb] = cVar43;
  auVar103[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * alVar4[1]._1_1_ - (0xff < uVar180);
  auVar103._0_12_ = auVar100;
  cVar44 = (uVar181 != 0) * (uVar181 < 0x100) * alVar4[1]._3_1_ - (0xff < uVar181);
  auVar103[0xd] = cVar44;
  auVar106[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * alVar4[1]._5_1_ - (0xff < uVar182);
  auVar106._0_14_ = auVar103;
  cVar45 = (uVar183 != 0) * (uVar183 < 0x100) * alVar4[1]._7_1_ - (0xff < uVar183);
  auVar106[0xf] = cVar45;
  uVar108 = (ushort)alVar5[0] >> 8;
  uVar119 = alVar5[0]._2_2_ >> 8;
  uVar120 = alVar5[0]._4_2_ >> 8;
  uVar121 = alVar5[0]._6_2_ >> 8;
  uVar122 = (ushort)alVar5[1] >> 8;
  uVar123 = alVar5[1]._2_2_ >> 8;
  uVar124 = alVar5[1]._4_2_ >> 8;
  uVar125 = alVar5[1]._6_2_ >> 8;
  uVar169 = (ushort)alVar107[0] >> 8;
  uVar177 = alVar107[0]._2_2_ >> 8;
  uVar178 = alVar107[0]._4_2_ >> 8;
  uVar179 = alVar107[0]._6_2_ >> 8;
  uVar180 = (ushort)alVar107[1] >> 8;
  uVar181 = alVar107[1]._2_2_ >> 8;
  uVar182 = alVar107[1]._4_2_ >> 8;
  uVar183 = alVar107[1]._6_2_ >> 8;
  bVar46 = (uVar119 != 0) * (uVar119 < 0x100) * alVar5[0]._3_1_ - (0xff < uVar119);
  cVar47 = (uVar121 != 0) * (uVar121 < 0x100) * alVar5[0]._7_1_ - (0xff < uVar121);
  uVar139 = CONCAT13(cVar47,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * alVar5[0]._5_1_ -
                                     (0xff < uVar120),
                                     CONCAT11(bVar46,(uVar108 != 0) * (uVar108 < 0x100) *
                                                     alVar5[0]._1_1_ - (0xff < uVar108))));
  cVar48 = (uVar123 != 0) * (uVar123 < 0x100) * alVar5[1]._3_1_ - (0xff < uVar123);
  uVar140 = CONCAT15(cVar48,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * alVar5[1]._1_1_ -
                                     (0xff < uVar122),uVar139));
  cVar49 = (uVar125 != 0) * (uVar125 < 0x100) * alVar5[1]._7_1_ - (0xff < uVar125);
  uVar141 = CONCAT17(cVar49,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * alVar5[1]._5_1_ -
                                     (0xff < uVar124),uVar140));
  cVar50 = (uVar177 != 0) * (uVar177 < 0x100) * alVar107[0]._3_1_ - (0xff < uVar177);
  auVar142._0_10_ =
       CONCAT19(cVar50,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * alVar107[0]._1_1_ -
                                (0xff < uVar169),uVar141));
  auVar142[10] = (uVar178 != 0) * (uVar178 < 0x100) * alVar107[0]._5_1_ - (0xff < uVar178);
  cVar51 = (uVar179 != 0) * (uVar179 < 0x100) * alVar107[0]._7_1_ - (0xff < uVar179);
  auVar142[0xb] = cVar51;
  auVar145[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * alVar107[1]._1_1_ - (0xff < uVar180);
  auVar145._0_12_ = auVar142;
  cVar52 = (uVar181 != 0) * (uVar181 < 0x100) * alVar107[1]._3_1_ - (0xff < uVar181);
  auVar145[0xd] = cVar52;
  auVar148[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * alVar107[1]._5_1_ - (0xff < uVar182);
  auVar148._0_14_ = auVar145;
  cVar53 = (uVar183 != 0) * (uVar183 < 0x100) * alVar107[1]._7_1_ - (0xff < uVar183);
  auVar148[0xf] = cVar53;
  auVar135 = auVar136 & _DAT_00123c80;
  auVar189 = auVar158 & _DAT_00123c80;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  sVar81 = auVar135._4_2_;
  sVar82 = auVar135._6_2_;
  sVar83 = auVar135._8_2_;
  sVar84 = auVar135._10_2_;
  sVar85 = auVar135._12_2_;
  sVar86 = auVar135._14_2_;
  sVar87 = auVar189._0_2_;
  sVar88 = auVar189._2_2_;
  sVar89 = auVar189._4_2_;
  sVar90 = auVar189._6_2_;
  sVar91 = auVar189._8_2_;
  sVar92 = auVar189._10_2_;
  sVar93 = auVar189._12_2_;
  sVar94 = auVar189._14_2_;
  *(char *)*in0 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0] - (0xff < sVar79);
  *(char *)((long)*in0 + 1) = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  *(char *)((long)*in0 + 2) = (0 < sVar81) * (sVar81 < 0x100) * auVar135[4] - (0xff < sVar81);
  *(char *)((long)*in0 + 3) = (0 < sVar82) * (sVar82 < 0x100) * auVar135[6] - (0xff < sVar82);
  *(char *)((long)*in0 + 4) = (0 < sVar83) * (sVar83 < 0x100) * auVar135[8] - (0xff < sVar83);
  *(char *)((long)*in0 + 5) = (0 < sVar84) * (sVar84 < 0x100) * auVar135[10] - (0xff < sVar84);
  *(char *)((long)*in0 + 6) = (0 < sVar85) * (sVar85 < 0x100) * auVar135[0xc] - (0xff < sVar85);
  *(char *)((long)*in0 + 7) = (0 < sVar86) * (sVar86 < 0x100) * auVar135[0xe] - (0xff < sVar86);
  *(char *)(*in0 + 1) = (0 < sVar87) * (sVar87 < 0x100) * auVar189[0] - (0xff < sVar87);
  *(char *)((long)*in0 + 9) = (0 < sVar88) * (sVar88 < 0x100) * auVar189[2] - (0xff < sVar88);
  *(char *)((long)*in0 + 10) = (0 < sVar89) * (sVar89 < 0x100) * auVar189[4] - (0xff < sVar89);
  *(char *)((long)*in0 + 0xb) = (0 < sVar90) * (sVar90 < 0x100) * auVar189[6] - (0xff < sVar90);
  *(char *)((long)*in0 + 0xc) = (0 < sVar91) * (sVar91 < 0x100) * auVar189[8] - (0xff < sVar91);
  *(char *)((long)*in0 + 0xd) = (0 < sVar92) * (sVar92 < 0x100) * auVar189[10] - (0xff < sVar92);
  *(char *)((long)*in0 + 0xe) = (0 < sVar93) * (sVar93 < 0x100) * auVar189[0xc] - (0xff < sVar93);
  *(char *)((long)*in0 + 0xf) = (0 < sVar94) * (sVar94 < 0x100) * auVar189[0xe] - (0xff < sVar94);
  auVar135 = auVar167 & auVar96;
  auVar189 = auVar175 & auVar96;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  sVar81 = auVar135._4_2_;
  sVar82 = auVar135._6_2_;
  sVar83 = auVar135._8_2_;
  sVar84 = auVar135._10_2_;
  sVar85 = auVar135._12_2_;
  sVar86 = auVar135._14_2_;
  sVar87 = auVar189._0_2_;
  sVar88 = auVar189._2_2_;
  sVar89 = auVar189._4_2_;
  sVar90 = auVar189._6_2_;
  sVar91 = auVar189._8_2_;
  sVar92 = auVar189._10_2_;
  sVar93 = auVar189._12_2_;
  sVar94 = auVar189._14_2_;
  *(char *)*in1 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0] - (0xff < sVar79);
  *(char *)((long)*in1 + 1) = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  *(char *)((long)*in1 + 2) = (0 < sVar81) * (sVar81 < 0x100) * auVar135[4] - (0xff < sVar81);
  *(char *)((long)*in1 + 3) = (0 < sVar82) * (sVar82 < 0x100) * auVar135[6] - (0xff < sVar82);
  *(char *)((long)*in1 + 4) = (0 < sVar83) * (sVar83 < 0x100) * auVar135[8] - (0xff < sVar83);
  *(char *)((long)*in1 + 5) = (0 < sVar84) * (sVar84 < 0x100) * auVar135[10] - (0xff < sVar84);
  *(char *)((long)*in1 + 6) = (0 < sVar85) * (sVar85 < 0x100) * auVar135[0xc] - (0xff < sVar85);
  *(char *)((long)*in1 + 7) = (0 < sVar86) * (sVar86 < 0x100) * auVar135[0xe] - (0xff < sVar86);
  *(char *)(*in1 + 1) = (0 < sVar87) * (sVar87 < 0x100) * auVar189[0] - (0xff < sVar87);
  *(char *)((long)*in1 + 9) = (0 < sVar88) * (sVar88 < 0x100) * auVar189[2] - (0xff < sVar88);
  *(char *)((long)*in1 + 10) = (0 < sVar89) * (sVar89 < 0x100) * auVar189[4] - (0xff < sVar89);
  *(char *)((long)*in1 + 0xb) = (0 < sVar90) * (sVar90 < 0x100) * auVar189[6] - (0xff < sVar90);
  *(char *)((long)*in1 + 0xc) = (0 < sVar91) * (sVar91 < 0x100) * auVar189[8] - (0xff < sVar91);
  *(char *)((long)*in1 + 0xd) = (0 < sVar92) * (sVar92 < 0x100) * auVar189[10] - (0xff < sVar92);
  *(char *)((long)*in1 + 0xe) = (0 < sVar93) * (sVar93 < 0x100) * auVar189[0xc] - (0xff < sVar93);
  *(char *)((long)*in1 + 0xf) = (0 < sVar94) * (sVar94 < 0x100) * auVar189[0xe] - (0xff < sVar94);
  auVar135 = auVar106 & auVar96;
  auVar189 = auVar148 & auVar96;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  sVar81 = auVar135._4_2_;
  sVar82 = auVar135._6_2_;
  sVar83 = auVar135._8_2_;
  sVar84 = auVar135._10_2_;
  sVar85 = auVar135._12_2_;
  sVar86 = auVar135._14_2_;
  sVar87 = auVar189._0_2_;
  sVar88 = auVar189._2_2_;
  sVar89 = auVar189._4_2_;
  sVar90 = auVar189._6_2_;
  sVar91 = auVar189._8_2_;
  sVar92 = auVar189._10_2_;
  sVar93 = auVar189._12_2_;
  sVar94 = auVar189._14_2_;
  *(char *)*in2 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0] - (0xff < sVar79);
  *(char *)((long)*in2 + 1) = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  *(char *)((long)*in2 + 2) = (0 < sVar81) * (sVar81 < 0x100) * auVar135[4] - (0xff < sVar81);
  *(char *)((long)*in2 + 3) = (0 < sVar82) * (sVar82 < 0x100) * auVar135[6] - (0xff < sVar82);
  *(char *)((long)*in2 + 4) = (0 < sVar83) * (sVar83 < 0x100) * auVar135[8] - (0xff < sVar83);
  *(char *)((long)*in2 + 5) = (0 < sVar84) * (sVar84 < 0x100) * auVar135[10] - (0xff < sVar84);
  *(char *)((long)*in2 + 6) = (0 < sVar85) * (sVar85 < 0x100) * auVar135[0xc] - (0xff < sVar85);
  *(char *)((long)*in2 + 7) = (0 < sVar86) * (sVar86 < 0x100) * auVar135[0xe] - (0xff < sVar86);
  *(char *)(*in2 + 1) = (0 < sVar87) * (sVar87 < 0x100) * auVar189[0] - (0xff < sVar87);
  *(char *)((long)*in2 + 9) = (0 < sVar88) * (sVar88 < 0x100) * auVar189[2] - (0xff < sVar88);
  *(char *)((long)*in2 + 10) = (0 < sVar89) * (sVar89 < 0x100) * auVar189[4] - (0xff < sVar89);
  *(char *)((long)*in2 + 0xb) = (0 < sVar90) * (sVar90 < 0x100) * auVar189[6] - (0xff < sVar90);
  *(char *)((long)*in2 + 0xc) = (0 < sVar91) * (sVar91 < 0x100) * auVar189[8] - (0xff < sVar91);
  *(char *)((long)*in2 + 0xd) = (0 < sVar92) * (sVar92 < 0x100) * auVar189[10] - (0xff < sVar92);
  *(char *)((long)*in2 + 0xe) = (0 < sVar93) * (sVar93 < 0x100) * auVar189[0xc] - (0xff < sVar93);
  *(char *)((long)*in2 + 0xf) = (0 < sVar94) * (sVar94 < 0x100) * auVar189[0xe] - (0xff < sVar94);
  uVar108 = (ushort)bVar6;
  uVar119 = (ushort)((uint)uVar126 >> 0x18);
  uVar120 = (ushort)((uint6)uVar127 >> 0x28);
  uVar121 = (ushort)((ulong)uVar128 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar129._0_10_ >> 0x48);
  uVar123 = auVar129._10_2_ >> 8;
  uVar124 = auVar132._12_2_ >> 8;
  uVar125 = auVar136._14_2_ >> 8;
  uVar169 = (ushort)bVar14;
  uVar177 = (ushort)((uint)uVar151 >> 0x18);
  uVar178 = (ushort)((uint6)uVar152 >> 0x28);
  uVar179 = (ushort)((ulong)uVar153 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar154._0_10_ >> 0x48);
  uVar181 = auVar154._10_2_ >> 8;
  uVar182 = auVar156._12_2_ >> 8;
  uVar183 = auVar158._14_2_ >> 8;
  *(byte *)*in3 = (uVar108 != 0) * (uVar108 < 0x100) * bVar6 - (0xff < uVar108);
  *(char *)((long)*in3 + 1) = (uVar119 != 0) * (uVar119 < 0x100) * cVar7 - (0xff < uVar119);
  *(char *)((long)*in3 + 2) = (uVar120 != 0) * (uVar120 < 0x100) * cVar8 - (0xff < uVar120);
  *(char *)((long)*in3 + 3) = (uVar121 != 0) * (uVar121 < 0x100) * cVar9 - (0xff < uVar121);
  *(char *)((long)*in3 + 4) = (uVar122 != 0) * (uVar122 < 0x100) * cVar10 - (0xff < uVar122);
  *(char *)((long)*in3 + 5) = (uVar123 != 0) * (uVar123 < 0x100) * cVar11 - (0xff < uVar123);
  *(char *)((long)*in3 + 6) = (uVar124 != 0) * (uVar124 < 0x100) * cVar12 - (0xff < uVar124);
  *(char *)((long)*in3 + 7) = (uVar125 != 0) * (uVar125 < 0x100) * cVar13 - (0xff < uVar125);
  *(byte *)(*in3 + 1) = (uVar169 != 0) * (uVar169 < 0x100) * bVar14 - (0xff < uVar169);
  *(char *)((long)*in3 + 9) = (uVar177 != 0) * (uVar177 < 0x100) * cVar15 - (0xff < uVar177);
  *(char *)((long)*in3 + 10) = (uVar178 != 0) * (uVar178 < 0x100) * cVar16 - (0xff < uVar178);
  *(char *)((long)*in3 + 0xb) = (uVar179 != 0) * (uVar179 < 0x100) * cVar17 - (0xff < uVar179);
  *(char *)((long)*in3 + 0xc) = (uVar180 != 0) * (uVar180 < 0x100) * cVar18 - (0xff < uVar180);
  *(char *)((long)*in3 + 0xd) = (uVar181 != 0) * (uVar181 < 0x100) * cVar19 - (0xff < uVar181);
  *(char *)((long)*in3 + 0xe) = (uVar182 != 0) * (uVar182 < 0x100) * cVar20 - (0xff < uVar182);
  *(char *)((long)*in3 + 0xf) = (uVar183 != 0) * (uVar183 < 0x100) * cVar21 - (0xff < uVar183);
  uVar169 = (ushort)bVar22;
  uVar177 = (ushort)((uint)uVar160 >> 0x18);
  uVar178 = (ushort)((uint6)uVar161 >> 0x28);
  uVar179 = (ushort)((ulong)uVar162 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar163._0_10_ >> 0x48);
  uVar181 = auVar163._10_2_ >> 8;
  uVar182 = auVar165._12_2_ >> 8;
  uVar183 = auVar167._14_2_ >> 8;
  uVar108 = (ushort)bVar30;
  uVar119 = (ushort)((uint)uVar109 >> 0x18);
  uVar120 = (ushort)((uint6)uVar110 >> 0x28);
  uVar121 = (ushort)((ulong)uVar111 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar112._0_10_ >> 0x48);
  uVar123 = auVar112._10_2_ >> 8;
  uVar124 = auVar115._12_2_ >> 8;
  uVar125 = auVar175._14_2_ >> 8;
  *(byte *)*in4 = (uVar169 != 0) * (uVar169 < 0x100) * bVar22 - (0xff < uVar169);
  *(char *)((long)*in4 + 1) = (uVar177 != 0) * (uVar177 < 0x100) * cVar23 - (0xff < uVar177);
  *(char *)((long)*in4 + 2) = (uVar178 != 0) * (uVar178 < 0x100) * cVar24 - (0xff < uVar178);
  *(char *)((long)*in4 + 3) = (uVar179 != 0) * (uVar179 < 0x100) * cVar25 - (0xff < uVar179);
  *(char *)((long)*in4 + 4) = (uVar180 != 0) * (uVar180 < 0x100) * cVar26 - (0xff < uVar180);
  *(char *)((long)*in4 + 5) = (uVar181 != 0) * (uVar181 < 0x100) * cVar27 - (0xff < uVar181);
  *(char *)((long)*in4 + 6) = (uVar182 != 0) * (uVar182 < 0x100) * cVar28 - (0xff < uVar182);
  *(char *)((long)*in4 + 7) = (uVar183 != 0) * (uVar183 < 0x100) * cVar29 - (0xff < uVar183);
  *(byte *)(*in4 + 1) = (uVar108 != 0) * (uVar108 < 0x100) * bVar30 - (0xff < uVar108);
  *(char *)((long)*in4 + 9) = (uVar119 != 0) * (uVar119 < 0x100) * cVar31 - (0xff < uVar119);
  *(char *)((long)*in4 + 10) = (uVar120 != 0) * (uVar120 < 0x100) * cVar32 - (0xff < uVar120);
  *(char *)((long)*in4 + 0xb) = (uVar121 != 0) * (uVar121 < 0x100) * cVar33 - (0xff < uVar121);
  *(char *)((long)*in4 + 0xc) = (uVar122 != 0) * (uVar122 < 0x100) * cVar34 - (0xff < uVar122);
  *(char *)((long)*in4 + 0xd) = (uVar123 != 0) * (uVar123 < 0x100) * cVar35 - (0xff < uVar123);
  *(char *)((long)*in4 + 0xe) = (uVar124 != 0) * (uVar124 < 0x100) * cVar36 - (0xff < uVar124);
  *(char *)((long)*in4 + 0xf) = (uVar125 != 0) * (uVar125 < 0x100) * cVar37 - (0xff < uVar125);
  uVar108 = (ushort)bVar38;
  uVar119 = (ushort)((uint)uVar97 >> 0x18);
  uVar120 = (ushort)((uint6)uVar98 >> 0x28);
  uVar121 = (ushort)((ulong)uVar99 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar100._0_10_ >> 0x48);
  uVar123 = auVar100._10_2_ >> 8;
  uVar124 = auVar103._12_2_ >> 8;
  uVar125 = auVar106._14_2_ >> 8;
  uVar169 = (ushort)bVar46;
  uVar177 = (ushort)((uint)uVar139 >> 0x18);
  uVar178 = (ushort)((uint6)uVar140 >> 0x28);
  uVar179 = (ushort)((ulong)uVar141 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar142._0_10_ >> 0x48);
  uVar181 = auVar142._10_2_ >> 8;
  uVar182 = auVar145._12_2_ >> 8;
  uVar183 = auVar148._14_2_ >> 8;
  bVar6 = (uVar119 != 0) * (uVar119 < 0x100) * cVar39 - (0xff < uVar119);
  cVar8 = (uVar121 != 0) * (uVar121 < 0x100) * cVar41 - (0xff < uVar121);
  uVar97 = CONCAT13(cVar8,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * cVar40 - (0xff < uVar120),
                                   CONCAT11(bVar6,(uVar108 != 0) * (uVar108 < 0x100) * bVar38 -
                                                  (0xff < uVar108))));
  cVar7 = (uVar123 != 0) * (uVar123 < 0x100) * cVar43 - (0xff < uVar123);
  uVar98 = CONCAT15(cVar7,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * cVar42 - (0xff < uVar122),
                                   uVar97));
  cVar13 = (uVar125 != 0) * (uVar125 < 0x100) * cVar45 - (0xff < uVar125);
  uVar99 = CONCAT17(cVar13,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * cVar44 - (0xff < uVar124),
                                    uVar98));
  cVar12 = (uVar177 != 0) * (uVar177 < 0x100) * cVar47 - (0xff < uVar177);
  auVar101._0_10_ =
       CONCAT19(cVar12,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * bVar46 - (0xff < uVar169),
                                uVar99));
  auVar101[10] = (uVar178 != 0) * (uVar178 < 0x100) * cVar48 - (0xff < uVar178);
  cVar10 = (uVar179 != 0) * (uVar179 < 0x100) * cVar49 - (0xff < uVar179);
  auVar101[0xb] = cVar10;
  auVar104[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * cVar50 - (0xff < uVar180);
  auVar104._0_12_ = auVar101;
  cVar9 = (uVar181 != 0) * (uVar181 < 0x100) * cVar51 - (0xff < uVar181);
  auVar104[0xd] = cVar9;
  alVar107[1]._6_1_ = (uVar182 != 0) * (uVar182 < 0x100) * cVar52 - (0xff < uVar182);
  alVar107._0_14_ = auVar104;
  cVar11 = (uVar183 != 0) * (uVar183 < 0x100) * cVar53 - (0xff < uVar183);
  alVar107[1]._7_1_ = cVar11;
  *in5 = alVar107;
  alVar1 = *in0;
  alVar2 = *in1;
  auVar135 = (undefined1  [16])alVar1 & auVar96;
  auVar106 = (undefined1  [16])alVar2 & auVar96;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  bVar14 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  sVar80 = auVar135._4_2_;
  sVar81 = auVar135._6_2_;
  cVar21 = (0 < sVar81) * (sVar81 < 0x100) * auVar135[6] - (0xff < sVar81);
  uVar126 = CONCAT13(cVar21,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar135[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar14,(0 < sVar79) * (sVar79 < 0x100) * auVar135[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar135._8_2_;
  sVar80 = auVar135._10_2_;
  cVar20 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[10] - (0xff < sVar80);
  uVar127 = CONCAT15(cVar20,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar135[8] - (0xff < sVar79)
                                     ,uVar126));
  sVar79 = auVar135._12_2_;
  sVar80 = auVar135._14_2_;
  cVar19 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[0xe] - (0xff < sVar80);
  uVar128 = CONCAT17(cVar19,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar135[0xc] -
                                     (0xff < sVar79),uVar127));
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  cVar18 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  auVar130._0_10_ =
       CONCAT19(cVar18,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79),
                                uVar128));
  sVar79 = auVar106._4_2_;
  auVar130[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[4] - (0xff < sVar79);
  sVar79 = auVar106._6_2_;
  cVar15 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[6] - (0xff < sVar79);
  auVar130[0xb] = cVar15;
  sVar79 = auVar106._8_2_;
  auVar133[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79);
  auVar133._0_12_ = auVar130;
  sVar79 = auVar106._10_2_;
  cVar17 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[10] - (0xff < sVar79);
  auVar133[0xd] = cVar17;
  sVar79 = auVar106._12_2_;
  auVar137[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] - (0xff < sVar79);
  auVar137._0_14_ = auVar133;
  sVar79 = auVar106._14_2_;
  cVar16 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xe] - (0xff < sVar79);
  auVar137[0xf] = cVar16;
  alVar3 = *in2;
  alVar4 = *in3;
  auVar135 = (undefined1  [16])alVar3 & auVar96;
  auVar106 = (undefined1  [16])alVar4 & auVar96;
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  bVar22 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  sVar80 = auVar135._4_2_;
  sVar81 = auVar135._6_2_;
  cVar23 = (0 < sVar81) * (sVar81 < 0x100) * auVar135[6] - (0xff < sVar81);
  uVar191 = CONCAT13(cVar23,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar135[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar22,(0 < sVar79) * (sVar79 < 0x100) * auVar135[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar135._8_2_;
  sVar80 = auVar135._10_2_;
  cVar29 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[10] - (0xff < sVar80);
  uVar192 = CONCAT15(cVar29,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar135[8] - (0xff < sVar79)
                                     ,uVar191));
  sVar79 = auVar135._12_2_;
  sVar80 = auVar135._14_2_;
  cVar28 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[0xe] - (0xff < sVar80);
  uVar193 = CONCAT17(cVar28,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar135[0xc] -
                                     (0xff < sVar79),uVar192));
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  cVar27 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  auVar194._0_10_ =
       CONCAT19(cVar27,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79),
                                uVar193));
  sVar79 = auVar106._4_2_;
  auVar194[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[4] - (0xff < sVar79);
  sVar79 = auVar106._6_2_;
  cVar26 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[6] - (0xff < sVar79);
  auVar194[0xb] = cVar26;
  sVar79 = auVar106._8_2_;
  auVar195[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79);
  auVar195._0_12_ = auVar194;
  sVar79 = auVar106._10_2_;
  cVar25 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[10] - (0xff < sVar79);
  auVar195[0xd] = cVar25;
  sVar79 = auVar106._12_2_;
  auVar196[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] - (0xff < sVar79);
  auVar196._0_14_ = auVar195;
  sVar79 = auVar106._14_2_;
  cVar24 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xe] - (0xff < sVar79);
  auVar196[0xf] = cVar24;
  alVar5 = *in4;
  auVar106 = (undefined1  [16])alVar5 & auVar96;
  auVar135 = (undefined1  [16])alVar107 & auVar96;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  bVar30 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  sVar80 = auVar106._4_2_;
  sVar81 = auVar106._6_2_;
  cVar33 = (0 < sVar81) * (sVar81 < 0x100) * auVar106[6] - (0xff < sVar81);
  uVar139 = CONCAT13(cVar33,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar106[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar30,(0 < sVar79) * (sVar79 < 0x100) * auVar106[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar106._8_2_;
  sVar80 = auVar106._10_2_;
  cVar34 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[10] - (0xff < sVar80);
  uVar140 = CONCAT15(cVar34,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79)
                                     ,uVar139));
  sVar79 = auVar106._12_2_;
  sVar80 = auVar106._14_2_;
  cVar32 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[0xe] - (0xff < sVar80);
  uVar141 = CONCAT17(cVar32,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] -
                                     (0xff < sVar79),uVar140));
  sVar79 = auVar135._0_2_;
  sVar80 = auVar135._2_2_;
  cVar35 = (0 < sVar80) * (sVar80 < 0x100) * auVar135[2] - (0xff < sVar80);
  auVar143._0_10_ =
       CONCAT19(cVar35,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar135[0] - (0xff < sVar79),
                                uVar141));
  sVar79 = auVar135._4_2_;
  auVar143[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar135[4] - (0xff < sVar79);
  sVar79 = auVar135._6_2_;
  cVar36 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[6] - (0xff < sVar79);
  auVar143[0xb] = cVar36;
  sVar79 = auVar135._8_2_;
  auVar146[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar135[8] - (0xff < sVar79);
  auVar146._0_12_ = auVar143;
  sVar79 = auVar135._10_2_;
  cVar37 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[10] - (0xff < sVar79);
  auVar146[0xd] = cVar37;
  sVar79 = auVar135._12_2_;
  auVar149[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0xc] - (0xff < sVar79);
  auVar149._0_14_ = auVar146;
  sVar79 = auVar135._14_2_;
  cVar31 = (0 < sVar79) * (sVar79 < 0x100) * auVar135[0xe] - (0xff < sVar79);
  auVar149[0xf] = cVar31;
  uVar108 = (ushort)alVar1[0] >> 8;
  uVar119 = alVar1[0]._2_2_ >> 8;
  uVar120 = alVar1[0]._4_2_ >> 8;
  uVar121 = alVar1[0]._6_2_ >> 8;
  uVar122 = (ushort)alVar1[1] >> 8;
  uVar123 = alVar1[1]._2_2_ >> 8;
  uVar124 = alVar1[1]._4_2_ >> 8;
  uVar125 = alVar1[1]._6_2_ >> 8;
  uVar169 = (ushort)alVar2[0] >> 8;
  uVar177 = alVar2[0]._2_2_ >> 8;
  uVar178 = alVar2[0]._4_2_ >> 8;
  uVar179 = alVar2[0]._6_2_ >> 8;
  uVar180 = (ushort)alVar2[1] >> 8;
  uVar181 = alVar2[1]._2_2_ >> 8;
  uVar182 = alVar2[1]._4_2_ >> 8;
  uVar183 = alVar2[1]._6_2_ >> 8;
  bVar38 = (uVar119 != 0) * (uVar119 < 0x100) * alVar1[0]._3_1_ - (0xff < uVar119);
  cVar39 = (uVar121 != 0) * (uVar121 < 0x100) * alVar1[0]._7_1_ - (0xff < uVar121);
  uVar151 = CONCAT13(cVar39,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * alVar1[0]._5_1_ -
                                     (0xff < uVar120),
                                     CONCAT11(bVar38,(uVar108 != 0) * (uVar108 < 0x100) *
                                                     alVar1[0]._1_1_ - (0xff < uVar108))));
  cVar40 = (uVar123 != 0) * (uVar123 < 0x100) * alVar1[1]._3_1_ - (0xff < uVar123);
  uVar152 = CONCAT15(cVar40,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * alVar1[1]._1_1_ -
                                     (0xff < uVar122),uVar151));
  cVar41 = (uVar125 != 0) * (uVar125 < 0x100) * alVar1[1]._7_1_ - (0xff < uVar125);
  uVar153 = CONCAT17(cVar41,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * alVar1[1]._5_1_ -
                                     (0xff < uVar124),uVar152));
  cVar42 = (uVar177 != 0) * (uVar177 < 0x100) * alVar2[0]._3_1_ - (0xff < uVar177);
  auVar155._0_10_ =
       CONCAT19(cVar42,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * alVar2[0]._1_1_ -
                                (0xff < uVar169),uVar153));
  auVar155[10] = (uVar178 != 0) * (uVar178 < 0x100) * alVar2[0]._5_1_ - (0xff < uVar178);
  cVar43 = (uVar179 != 0) * (uVar179 < 0x100) * alVar2[0]._7_1_ - (0xff < uVar179);
  auVar155[0xb] = cVar43;
  auVar157[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * alVar2[1]._1_1_ - (0xff < uVar180);
  auVar157._0_12_ = auVar155;
  cVar44 = (uVar181 != 0) * (uVar181 < 0x100) * alVar2[1]._3_1_ - (0xff < uVar181);
  auVar157[0xd] = cVar44;
  auVar159[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * alVar2[1]._5_1_ - (0xff < uVar182);
  auVar159._0_14_ = auVar157;
  cVar45 = (uVar183 != 0) * (uVar183 < 0x100) * alVar2[1]._7_1_ - (0xff < uVar183);
  auVar159[0xf] = cVar45;
  uVar108 = (ushort)alVar3[0] >> 8;
  uVar119 = alVar3[0]._2_2_ >> 8;
  uVar120 = alVar3[0]._4_2_ >> 8;
  uVar121 = alVar3[0]._6_2_ >> 8;
  uVar122 = (ushort)alVar3[1] >> 8;
  uVar123 = alVar3[1]._2_2_ >> 8;
  uVar124 = alVar3[1]._4_2_ >> 8;
  uVar125 = alVar3[1]._6_2_ >> 8;
  uVar169 = (ushort)alVar4[0] >> 8;
  uVar177 = alVar4[0]._2_2_ >> 8;
  uVar178 = alVar4[0]._4_2_ >> 8;
  uVar179 = alVar4[0]._6_2_ >> 8;
  uVar180 = (ushort)alVar4[1] >> 8;
  uVar181 = alVar4[1]._2_2_ >> 8;
  uVar182 = alVar4[1]._4_2_ >> 8;
  uVar183 = alVar4[1]._6_2_ >> 8;
  bVar46 = (uVar119 != 0) * (uVar119 < 0x100) * alVar3[0]._3_1_ - (0xff < uVar119);
  cVar47 = (uVar121 != 0) * (uVar121 < 0x100) * alVar3[0]._7_1_ - (0xff < uVar121);
  uVar109 = CONCAT13(cVar47,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * alVar3[0]._5_1_ -
                                     (0xff < uVar120),
                                     CONCAT11(bVar46,(uVar108 != 0) * (uVar108 < 0x100) *
                                                     alVar3[0]._1_1_ - (0xff < uVar108))));
  cVar50 = (uVar123 != 0) * (uVar123 < 0x100) * alVar3[1]._3_1_ - (0xff < uVar123);
  uVar110 = CONCAT15(cVar50,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * alVar3[1]._1_1_ -
                                     (0xff < uVar122),uVar109));
  cVar48 = (uVar125 != 0) * (uVar125 < 0x100) * alVar3[1]._7_1_ - (0xff < uVar125);
  uVar111 = CONCAT17(cVar48,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * alVar3[1]._5_1_ -
                                     (0xff < uVar124),uVar110));
  cVar49 = (uVar177 != 0) * (uVar177 < 0x100) * alVar4[0]._3_1_ - (0xff < uVar177);
  auVar113._0_10_ =
       CONCAT19(cVar49,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * alVar4[0]._1_1_ -
                                (0xff < uVar169),uVar111));
  auVar113[10] = (uVar178 != 0) * (uVar178 < 0x100) * alVar4[0]._5_1_ - (0xff < uVar178);
  cVar51 = (uVar179 != 0) * (uVar179 < 0x100) * alVar4[0]._7_1_ - (0xff < uVar179);
  auVar113[0xb] = cVar51;
  auVar116[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * alVar4[1]._1_1_ - (0xff < uVar180);
  auVar116._0_12_ = auVar113;
  cVar52 = (uVar181 != 0) * (uVar181 < 0x100) * alVar4[1]._3_1_ - (0xff < uVar181);
  auVar116[0xd] = cVar52;
  auVar189[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * alVar4[1]._5_1_ - (0xff < uVar182);
  auVar189._0_14_ = auVar116;
  cVar53 = (uVar183 != 0) * (uVar183 < 0x100) * alVar4[1]._7_1_ - (0xff < uVar183);
  auVar189[0xf] = cVar53;
  uVar169 = (ushort)alVar5[0] >> 8;
  uVar177 = alVar5[0]._2_2_ >> 8;
  uVar178 = alVar5[0]._4_2_ >> 8;
  uVar179 = alVar5[0]._6_2_ >> 8;
  uVar180 = (ushort)alVar5[1] >> 8;
  uVar181 = alVar5[1]._2_2_ >> 8;
  uVar182 = alVar5[1]._4_2_ >> 8;
  uVar183 = alVar5[1]._6_2_ >> 8;
  uVar108 = (ushort)bVar6;
  uVar119 = (ushort)((uint)uVar97 >> 0x18);
  uVar120 = (ushort)((uint6)uVar98 >> 0x28);
  uVar121 = (ushort)((ulong)uVar99 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar101._0_10_ >> 0x48);
  uVar123 = auVar101._10_2_ >> 8;
  uVar124 = auVar104._12_2_ >> 8;
  uVar125 = alVar107[1]._6_2_ >> 8;
  bVar54 = (uVar177 != 0) * (uVar177 < 0x100) * alVar5[0]._3_1_ - (0xff < uVar177);
  cVar55 = (uVar179 != 0) * (uVar179 < 0x100) * alVar5[0]._7_1_ - (0xff < uVar179);
  uVar160 = CONCAT13(cVar55,CONCAT12((uVar178 != 0) * (uVar178 < 0x100) * alVar5[0]._5_1_ -
                                     (0xff < uVar178),
                                     CONCAT11(bVar54,(uVar169 != 0) * (uVar169 < 0x100) *
                                                     alVar5[0]._1_1_ - (0xff < uVar169))));
  cVar56 = (uVar181 != 0) * (uVar181 < 0x100) * alVar5[1]._3_1_ - (0xff < uVar181);
  uVar161 = CONCAT15(cVar56,CONCAT14((uVar180 != 0) * (uVar180 < 0x100) * alVar5[1]._1_1_ -
                                     (0xff < uVar180),uVar160));
  cVar57 = (uVar183 != 0) * (uVar183 < 0x100) * alVar5[1]._7_1_ - (0xff < uVar183);
  uVar162 = CONCAT17(cVar57,CONCAT16((uVar182 != 0) * (uVar182 < 0x100) * alVar5[1]._5_1_ -
                                     (0xff < uVar182),uVar161));
  cVar58 = (uVar119 != 0) * (uVar119 < 0x100) * cVar8 - (0xff < uVar119);
  auVar164._0_10_ =
       CONCAT19(cVar58,CONCAT18((uVar108 != 0) * (uVar108 < 0x100) * bVar6 - (0xff < uVar108),
                                uVar162));
  auVar164[10] = (uVar120 != 0) * (uVar120 < 0x100) * cVar7 - (0xff < uVar120);
  cVar13 = (uVar121 != 0) * (uVar121 < 0x100) * cVar13 - (0xff < uVar121);
  auVar164[0xb] = cVar13;
  auVar166[0xc] = (uVar122 != 0) * (uVar122 < 0x100) * cVar12 - (0xff < uVar122);
  auVar166._0_12_ = auVar164;
  cVar7 = (uVar123 != 0) * (uVar123 < 0x100) * cVar10 - (0xff < uVar123);
  auVar166[0xd] = cVar7;
  auVar168[0xe] = (uVar124 != 0) * (uVar124 < 0x100) * cVar9 - (0xff < uVar124);
  auVar168._0_14_ = auVar166;
  cVar8 = (uVar125 != 0) * (uVar125 < 0x100) * cVar11 - (0xff < uVar125);
  auVar168[0xf] = cVar8;
  auVar106 = auVar137 & auVar96;
  auVar175 = auVar196 & auVar96;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  bVar6 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  sVar80 = auVar106._4_2_;
  sVar81 = auVar106._6_2_;
  cVar12 = (0 < sVar81) * (sVar81 < 0x100) * auVar106[6] - (0xff < sVar81);
  uVar97 = CONCAT13(cVar12,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar106[4] - (0xff < sVar80),
                                    CONCAT11(bVar6,(0 < sVar79) * (sVar79 < 0x100) * auVar106[0] -
                                                   (0xff < sVar79))));
  sVar79 = auVar106._8_2_;
  sVar80 = auVar106._10_2_;
  cVar10 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[10] - (0xff < sVar80);
  uVar98 = CONCAT15(cVar10,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79),
                                    uVar97));
  sVar79 = auVar106._12_2_;
  sVar80 = auVar106._14_2_;
  cVar9 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[0xe] - (0xff < sVar80);
  uVar99 = CONCAT17(cVar9,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] - (0xff < sVar79)
                                   ,uVar98));
  sVar79 = auVar175._0_2_;
  sVar80 = auVar175._2_2_;
  cVar11 = (0 < sVar80) * (sVar80 < 0x100) * auVar175[2] - (0xff < sVar80);
  auVar102._0_10_ =
       CONCAT19(cVar11,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar175[0] - (0xff < sVar79),
                                uVar99));
  sVar79 = auVar175._4_2_;
  auVar102[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar175[4] - (0xff < sVar79);
  sVar79 = auVar175._6_2_;
  cVar59 = (0 < sVar79) * (sVar79 < 0x100) * auVar175[6] - (0xff < sVar79);
  auVar102[0xb] = cVar59;
  sVar79 = auVar175._8_2_;
  auVar105[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar175[8] - (0xff < sVar79);
  auVar105._0_12_ = auVar102;
  sVar79 = auVar175._10_2_;
  cVar60 = (0 < sVar79) * (sVar79 < 0x100) * auVar175[10] - (0xff < sVar79);
  auVar105[0xd] = cVar60;
  sVar79 = auVar175._12_2_;
  auVar135[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar175[0xc] - (0xff < sVar79);
  auVar135._0_14_ = auVar105;
  sVar79 = auVar175._14_2_;
  cVar61 = (0 < sVar79) * (sVar79 < 0x100) * auVar175[0xe] - (0xff < sVar79);
  auVar135[0xf] = cVar61;
  auVar175 = auVar149 & auVar96;
  auVar106 = auVar159 & auVar96;
  sVar79 = auVar175._0_2_;
  sVar80 = auVar175._2_2_;
  bVar62 = (0 < sVar80) * (sVar80 < 0x100) * auVar175[2] - (0xff < sVar80);
  sVar80 = auVar175._4_2_;
  sVar81 = auVar175._6_2_;
  cVar63 = (0 < sVar81) * (sVar81 < 0x100) * auVar175[6] - (0xff < sVar81);
  uVar184 = CONCAT13(cVar63,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar175[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar62,(0 < sVar79) * (sVar79 < 0x100) * auVar175[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar175._8_2_;
  sVar80 = auVar175._10_2_;
  cVar64 = (0 < sVar80) * (sVar80 < 0x100) * auVar175[10] - (0xff < sVar80);
  uVar185 = CONCAT15(cVar64,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar175[8] - (0xff < sVar79)
                                     ,uVar184));
  sVar79 = auVar175._12_2_;
  sVar80 = auVar175._14_2_;
  cVar65 = (0 < sVar80) * (sVar80 < 0x100) * auVar175[0xe] - (0xff < sVar80);
  uVar186 = CONCAT17(cVar65,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar175[0xc] -
                                     (0xff < sVar79),uVar185));
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  cVar66 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  auVar187._0_10_ =
       CONCAT19(cVar66,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79),
                                uVar186));
  sVar79 = auVar106._4_2_;
  auVar187[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[4] - (0xff < sVar79);
  sVar79 = auVar106._6_2_;
  cVar67 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[6] - (0xff < sVar79);
  auVar187[0xb] = cVar67;
  sVar79 = auVar106._8_2_;
  auVar188[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79);
  auVar188._0_12_ = auVar187;
  sVar79 = auVar106._10_2_;
  cVar68 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[10] - (0xff < sVar79);
  auVar188[0xd] = cVar68;
  sVar79 = auVar106._12_2_;
  auVar190[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] - (0xff < sVar79);
  auVar190._0_14_ = auVar188;
  sVar79 = auVar106._14_2_;
  cVar69 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0xe] - (0xff < sVar79);
  auVar190[0xf] = cVar69;
  auVar106 = auVar189 & auVar96;
  auVar175 = auVar168 & auVar96;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  bVar70 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  sVar80 = auVar106._4_2_;
  sVar81 = auVar106._6_2_;
  cVar71 = (0 < sVar81) * (sVar81 < 0x100) * auVar106[6] - (0xff < sVar81);
  uVar170 = CONCAT13(cVar71,CONCAT12((0 < sVar80) * (sVar80 < 0x100) * auVar106[4] - (0xff < sVar80)
                                     ,CONCAT11(bVar70,(0 < sVar79) * (sVar79 < 0x100) * auVar106[0]
                                                      - (0xff < sVar79))));
  sVar79 = auVar106._8_2_;
  sVar80 = auVar106._10_2_;
  cVar72 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[10] - (0xff < sVar80);
  uVar171 = CONCAT15(cVar72,CONCAT14((0 < sVar79) * (sVar79 < 0x100) * auVar106[8] - (0xff < sVar79)
                                     ,uVar170));
  sVar79 = auVar106._12_2_;
  sVar80 = auVar106._14_2_;
  cVar73 = (0 < sVar80) * (sVar80 < 0x100) * auVar106[0xe] - (0xff < sVar80);
  uVar172 = CONCAT17(cVar73,CONCAT16((0 < sVar79) * (sVar79 < 0x100) * auVar106[0xc] -
                                     (0xff < sVar79),uVar171));
  sVar79 = auVar175._0_2_;
  sVar80 = auVar175._2_2_;
  cVar74 = (0 < sVar80) * (sVar80 < 0x100) * auVar175[2] - (0xff < sVar80);
  auVar173._0_10_ =
       CONCAT19(cVar74,CONCAT18((0 < sVar79) * (sVar79 < 0x100) * auVar175[0] - (0xff < sVar79),
                                uVar172));
  sVar79 = auVar175._4_2_;
  auVar173[10] = (0 < sVar79) * (sVar79 < 0x100) * auVar175[4] - (0xff < sVar79);
  sVar79 = auVar175._6_2_;
  cVar75 = (0 < sVar79) * (sVar79 < 0x100) * auVar175[6] - (0xff < sVar79);
  auVar173[0xb] = cVar75;
  sVar79 = auVar175._8_2_;
  auVar174[0xc] = (0 < sVar79) * (sVar79 < 0x100) * auVar175[8] - (0xff < sVar79);
  auVar174._0_12_ = auVar173;
  sVar79 = auVar175._10_2_;
  cVar76 = (0 < sVar79) * (sVar79 < 0x100) * auVar175[10] - (0xff < sVar79);
  auVar174[0xd] = cVar76;
  sVar79 = auVar175._12_2_;
  auVar176[0xe] = (0 < sVar79) * (sVar79 < 0x100) * auVar175[0xc] - (0xff < sVar79);
  auVar176._0_14_ = auVar174;
  sVar79 = auVar175._14_2_;
  cVar77 = (0 < sVar79) * (sVar79 < 0x100) * auVar175[0xe] - (0xff < sVar79);
  auVar176[0xf] = cVar77;
  uVar108 = (ushort)bVar14;
  uVar119 = (ushort)((uint)uVar126 >> 0x18);
  uVar120 = (ushort)((uint6)uVar127 >> 0x28);
  uVar121 = (ushort)((ulong)uVar128 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar130._0_10_ >> 0x48);
  uVar123 = auVar130._10_2_ >> 8;
  uVar124 = auVar133._12_2_ >> 8;
  uVar125 = auVar137._14_2_ >> 8;
  uVar169 = (ushort)bVar22;
  uVar177 = (ushort)((uint)uVar191 >> 0x18);
  uVar178 = (ushort)((uint6)uVar192 >> 0x28);
  uVar179 = (ushort)((ulong)uVar193 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar194._0_10_ >> 0x48);
  uVar181 = auVar194._10_2_ >> 8;
  uVar182 = auVar195._12_2_ >> 8;
  uVar183 = auVar196._14_2_ >> 8;
  bVar78 = (uVar119 != 0) * (uVar119 < 0x100) * cVar21 - (0xff < uVar119);
  cVar21 = (uVar121 != 0) * (uVar121 < 0x100) * cVar19 - (0xff < uVar121);
  uVar126 = CONCAT13(cVar21,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * cVar20 - (0xff < uVar120),
                                     CONCAT11(bVar78,(uVar108 != 0) * (uVar108 < 0x100) * bVar14 -
                                                     (0xff < uVar108))));
  cVar19 = (uVar123 != 0) * (uVar123 < 0x100) * cVar15 - (0xff < uVar123);
  uVar127 = CONCAT15(cVar19,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * cVar18 - (0xff < uVar122),
                                     uVar126));
  cVar18 = (uVar125 != 0) * (uVar125 < 0x100) * cVar16 - (0xff < uVar125);
  uVar128 = CONCAT17(cVar18,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * cVar17 - (0xff < uVar124),
                                     uVar127));
  cVar20 = (uVar177 != 0) * (uVar177 < 0x100) * cVar23 - (0xff < uVar177);
  auVar131._0_10_ =
       CONCAT19(cVar20,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * bVar22 - (0xff < uVar169),
                                uVar128));
  auVar131[10] = (uVar178 != 0) * (uVar178 < 0x100) * cVar29 - (0xff < uVar178);
  cVar17 = (uVar179 != 0) * (uVar179 < 0x100) * cVar28 - (0xff < uVar179);
  auVar131[0xb] = cVar17;
  auVar134[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * cVar27 - (0xff < uVar180);
  auVar134._0_12_ = auVar131;
  cVar15 = (uVar181 != 0) * (uVar181 < 0x100) * cVar26 - (0xff < uVar181);
  auVar134[0xd] = cVar15;
  auVar138[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * cVar25 - (0xff < uVar182);
  auVar138._0_14_ = auVar134;
  cVar16 = (uVar183 != 0) * (uVar183 < 0x100) * cVar24 - (0xff < uVar183);
  auVar138[0xf] = cVar16;
  uVar108 = (ushort)bVar30;
  uVar119 = (ushort)((uint)uVar139 >> 0x18);
  uVar120 = (ushort)((uint6)uVar140 >> 0x28);
  uVar121 = (ushort)((ulong)uVar141 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar143._0_10_ >> 0x48);
  uVar123 = auVar143._10_2_ >> 8;
  uVar124 = auVar146._12_2_ >> 8;
  uVar125 = auVar149._14_2_ >> 8;
  uVar169 = (ushort)bVar38;
  uVar177 = (ushort)((uint)uVar151 >> 0x18);
  uVar178 = (ushort)((uint6)uVar152 >> 0x28);
  uVar179 = (ushort)((ulong)uVar153 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar155._0_10_ >> 0x48);
  uVar181 = auVar155._10_2_ >> 8;
  uVar182 = auVar157._12_2_ >> 8;
  uVar183 = auVar159._14_2_ >> 8;
  bVar14 = (uVar119 != 0) * (uVar119 < 0x100) * cVar33 - (0xff < uVar119);
  cVar24 = (uVar121 != 0) * (uVar121 < 0x100) * cVar32 - (0xff < uVar121);
  uVar139 = CONCAT13(cVar24,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * cVar34 - (0xff < uVar120),
                                     CONCAT11(bVar14,(uVar108 != 0) * (uVar108 < 0x100) * bVar30 -
                                                     (0xff < uVar108))));
  cVar25 = (uVar123 != 0) * (uVar123 < 0x100) * cVar36 - (0xff < uVar123);
  uVar140 = CONCAT15(cVar25,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * cVar35 - (0xff < uVar122),
                                     uVar139));
  cVar26 = (uVar125 != 0) * (uVar125 < 0x100) * cVar31 - (0xff < uVar125);
  uVar141 = CONCAT17(cVar26,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * cVar37 - (0xff < uVar124),
                                     uVar140));
  cVar27 = (uVar177 != 0) * (uVar177 < 0x100) * cVar39 - (0xff < uVar177);
  auVar144._0_10_ =
       CONCAT19(cVar27,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * bVar38 - (0xff < uVar169),
                                uVar141));
  auVar144[10] = (uVar178 != 0) * (uVar178 < 0x100) * cVar40 - (0xff < uVar178);
  cVar28 = (uVar179 != 0) * (uVar179 < 0x100) * cVar41 - (0xff < uVar179);
  auVar144[0xb] = cVar28;
  auVar147[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * cVar42 - (0xff < uVar180);
  auVar147._0_12_ = auVar144;
  cVar23 = (uVar181 != 0) * (uVar181 < 0x100) * cVar43 - (0xff < uVar181);
  auVar147[0xd] = cVar23;
  auVar150[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * cVar44 - (0xff < uVar182);
  auVar150._0_14_ = auVar147;
  cVar29 = (uVar183 != 0) * (uVar183 < 0x100) * cVar45 - (0xff < uVar183);
  auVar150[0xf] = cVar29;
  uVar108 = (ushort)bVar46;
  uVar119 = (ushort)((uint)uVar109 >> 0x18);
  uVar120 = (ushort)((uint6)uVar110 >> 0x28);
  uVar121 = (ushort)((ulong)uVar111 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar113._0_10_ >> 0x48);
  uVar123 = auVar113._10_2_ >> 8;
  uVar124 = auVar116._12_2_ >> 8;
  uVar125 = auVar189._14_2_ >> 8;
  uVar169 = (ushort)bVar54;
  uVar177 = (ushort)((uint)uVar160 >> 0x18);
  uVar178 = (ushort)((uint6)uVar161 >> 0x28);
  uVar179 = (ushort)((ulong)uVar162 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar164._0_10_ >> 0x48);
  uVar181 = auVar164._10_2_ >> 8;
  uVar182 = auVar166._12_2_ >> 8;
  uVar183 = auVar168._14_2_ >> 8;
  bVar22 = (uVar119 != 0) * (uVar119 < 0x100) * cVar47 - (0xff < uVar119);
  cVar31 = (uVar121 != 0) * (uVar121 < 0x100) * cVar48 - (0xff < uVar121);
  uVar109 = CONCAT13(cVar31,CONCAT12((uVar120 != 0) * (uVar120 < 0x100) * cVar50 - (0xff < uVar120),
                                     CONCAT11(bVar22,(uVar108 != 0) * (uVar108 < 0x100) * bVar46 -
                                                     (0xff < uVar108))));
  cVar37 = (uVar123 != 0) * (uVar123 < 0x100) * cVar51 - (0xff < uVar123);
  uVar110 = CONCAT15(cVar37,CONCAT14((uVar122 != 0) * (uVar122 < 0x100) * cVar49 - (0xff < uVar122),
                                     uVar109));
  cVar36 = (uVar125 != 0) * (uVar125 < 0x100) * cVar53 - (0xff < uVar125);
  uVar111 = CONCAT17(cVar36,CONCAT16((uVar124 != 0) * (uVar124 < 0x100) * cVar52 - (0xff < uVar124),
                                     uVar110));
  cVar35 = (uVar177 != 0) * (uVar177 < 0x100) * cVar55 - (0xff < uVar177);
  auVar114._0_10_ =
       CONCAT19(cVar35,CONCAT18((uVar169 != 0) * (uVar169 < 0x100) * bVar54 - (0xff < uVar169),
                                uVar111));
  auVar114[10] = (uVar178 != 0) * (uVar178 < 0x100) * cVar56 - (0xff < uVar178);
  cVar34 = (uVar179 != 0) * (uVar179 < 0x100) * cVar57 - (0xff < uVar179);
  auVar114[0xb] = cVar34;
  auVar117[0xc] = (uVar180 != 0) * (uVar180 < 0x100) * cVar58 - (0xff < uVar180);
  auVar117._0_12_ = auVar114;
  cVar13 = (uVar181 != 0) * (uVar181 < 0x100) * cVar13 - (0xff < uVar181);
  auVar117[0xd] = cVar13;
  auVar118[0xe] = (uVar182 != 0) * (uVar182 < 0x100) * cVar7 - (0xff < uVar182);
  auVar118._0_14_ = auVar117;
  cVar8 = (uVar183 != 0) * (uVar183 < 0x100) * cVar8 - (0xff < uVar183);
  auVar118[0xf] = cVar8;
  auVar106 = auVar135 & auVar96;
  auVar175 = auVar190 & auVar96;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  sVar81 = auVar106._4_2_;
  sVar82 = auVar106._6_2_;
  sVar83 = auVar106._8_2_;
  sVar84 = auVar106._10_2_;
  sVar85 = auVar106._12_2_;
  sVar86 = auVar106._14_2_;
  sVar87 = auVar175._0_2_;
  sVar88 = auVar175._2_2_;
  sVar89 = auVar175._4_2_;
  sVar90 = auVar175._6_2_;
  sVar91 = auVar175._8_2_;
  sVar92 = auVar175._10_2_;
  sVar93 = auVar175._12_2_;
  sVar94 = auVar175._14_2_;
  *(char *)*in0 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79);
  *(char *)((long)*in0 + 1) = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  *(char *)((long)*in0 + 2) = (0 < sVar81) * (sVar81 < 0x100) * auVar106[4] - (0xff < sVar81);
  *(char *)((long)*in0 + 3) = (0 < sVar82) * (sVar82 < 0x100) * auVar106[6] - (0xff < sVar82);
  *(char *)((long)*in0 + 4) = (0 < sVar83) * (sVar83 < 0x100) * auVar106[8] - (0xff < sVar83);
  *(char *)((long)*in0 + 5) = (0 < sVar84) * (sVar84 < 0x100) * auVar106[10] - (0xff < sVar84);
  *(char *)((long)*in0 + 6) = (0 < sVar85) * (sVar85 < 0x100) * auVar106[0xc] - (0xff < sVar85);
  *(char *)((long)*in0 + 7) = (0 < sVar86) * (sVar86 < 0x100) * auVar106[0xe] - (0xff < sVar86);
  *(char *)(*in0 + 1) = (0 < sVar87) * (sVar87 < 0x100) * auVar175[0] - (0xff < sVar87);
  *(char *)((long)*in0 + 9) = (0 < sVar88) * (sVar88 < 0x100) * auVar175[2] - (0xff < sVar88);
  *(char *)((long)*in0 + 10) = (0 < sVar89) * (sVar89 < 0x100) * auVar175[4] - (0xff < sVar89);
  *(char *)((long)*in0 + 0xb) = (0 < sVar90) * (sVar90 < 0x100) * auVar175[6] - (0xff < sVar90);
  *(char *)((long)*in0 + 0xc) = (0 < sVar91) * (sVar91 < 0x100) * auVar175[8] - (0xff < sVar91);
  *(char *)((long)*in0 + 0xd) = (0 < sVar92) * (sVar92 < 0x100) * auVar175[10] - (0xff < sVar92);
  *(char *)((long)*in0 + 0xe) = (0 < sVar93) * (sVar93 < 0x100) * auVar175[0xc] - (0xff < sVar93);
  *(char *)((long)*in0 + 0xf) = (0 < sVar94) * (sVar94 < 0x100) * auVar175[0xe] - (0xff < sVar94);
  auVar106 = auVar176 & auVar96;
  auVar175 = auVar138 & auVar96;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  sVar81 = auVar106._4_2_;
  sVar82 = auVar106._6_2_;
  sVar83 = auVar106._8_2_;
  sVar84 = auVar106._10_2_;
  sVar85 = auVar106._12_2_;
  sVar86 = auVar106._14_2_;
  sVar87 = auVar175._0_2_;
  sVar88 = auVar175._2_2_;
  sVar89 = auVar175._4_2_;
  sVar90 = auVar175._6_2_;
  sVar91 = auVar175._8_2_;
  sVar92 = auVar175._10_2_;
  sVar93 = auVar175._12_2_;
  sVar94 = auVar175._14_2_;
  *(char *)*in1 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79);
  *(char *)((long)*in1 + 1) = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  *(char *)((long)*in1 + 2) = (0 < sVar81) * (sVar81 < 0x100) * auVar106[4] - (0xff < sVar81);
  *(char *)((long)*in1 + 3) = (0 < sVar82) * (sVar82 < 0x100) * auVar106[6] - (0xff < sVar82);
  *(char *)((long)*in1 + 4) = (0 < sVar83) * (sVar83 < 0x100) * auVar106[8] - (0xff < sVar83);
  *(char *)((long)*in1 + 5) = (0 < sVar84) * (sVar84 < 0x100) * auVar106[10] - (0xff < sVar84);
  *(char *)((long)*in1 + 6) = (0 < sVar85) * (sVar85 < 0x100) * auVar106[0xc] - (0xff < sVar85);
  *(char *)((long)*in1 + 7) = (0 < sVar86) * (sVar86 < 0x100) * auVar106[0xe] - (0xff < sVar86);
  *(char *)(*in1 + 1) = (0 < sVar87) * (sVar87 < 0x100) * auVar175[0] - (0xff < sVar87);
  *(char *)((long)*in1 + 9) = (0 < sVar88) * (sVar88 < 0x100) * auVar175[2] - (0xff < sVar88);
  *(char *)((long)*in1 + 10) = (0 < sVar89) * (sVar89 < 0x100) * auVar175[4] - (0xff < sVar89);
  *(char *)((long)*in1 + 0xb) = (0 < sVar90) * (sVar90 < 0x100) * auVar175[6] - (0xff < sVar90);
  *(char *)((long)*in1 + 0xc) = (0 < sVar91) * (sVar91 < 0x100) * auVar175[8] - (0xff < sVar91);
  *(char *)((long)*in1 + 0xd) = (0 < sVar92) * (sVar92 < 0x100) * auVar175[10] - (0xff < sVar92);
  *(char *)((long)*in1 + 0xe) = (0 < sVar93) * (sVar93 < 0x100) * auVar175[0xc] - (0xff < sVar93);
  *(char *)((long)*in1 + 0xf) = (0 < sVar94) * (sVar94 < 0x100) * auVar175[0xe] - (0xff < sVar94);
  auVar106 = auVar150 & auVar96;
  auVar96 = auVar96 & auVar118;
  sVar79 = auVar106._0_2_;
  sVar80 = auVar106._2_2_;
  sVar81 = auVar106._4_2_;
  sVar82 = auVar106._6_2_;
  sVar83 = auVar106._8_2_;
  sVar84 = auVar106._10_2_;
  sVar85 = auVar106._12_2_;
  sVar86 = auVar106._14_2_;
  sVar87 = auVar96._0_2_;
  sVar88 = auVar96._2_2_;
  sVar89 = auVar96._4_2_;
  sVar90 = auVar96._6_2_;
  sVar91 = auVar96._8_2_;
  sVar92 = auVar96._10_2_;
  sVar93 = auVar96._12_2_;
  sVar94 = auVar96._14_2_;
  *(char *)*in2 = (0 < sVar79) * (sVar79 < 0x100) * auVar106[0] - (0xff < sVar79);
  *(char *)((long)*in2 + 1) = (0 < sVar80) * (sVar80 < 0x100) * auVar106[2] - (0xff < sVar80);
  *(char *)((long)*in2 + 2) = (0 < sVar81) * (sVar81 < 0x100) * auVar106[4] - (0xff < sVar81);
  *(char *)((long)*in2 + 3) = (0 < sVar82) * (sVar82 < 0x100) * auVar106[6] - (0xff < sVar82);
  *(char *)((long)*in2 + 4) = (0 < sVar83) * (sVar83 < 0x100) * auVar106[8] - (0xff < sVar83);
  *(char *)((long)*in2 + 5) = (0 < sVar84) * (sVar84 < 0x100) * auVar106[10] - (0xff < sVar84);
  *(char *)((long)*in2 + 6) = (0 < sVar85) * (sVar85 < 0x100) * auVar106[0xc] - (0xff < sVar85);
  *(char *)((long)*in2 + 7) = (0 < sVar86) * (sVar86 < 0x100) * auVar106[0xe] - (0xff < sVar86);
  *(char *)(*in2 + 1) = (0 < sVar87) * (sVar87 < 0x100) * auVar96[0] - (0xff < sVar87);
  *(char *)((long)*in2 + 9) = (0 < sVar88) * (sVar88 < 0x100) * auVar96[2] - (0xff < sVar88);
  *(char *)((long)*in2 + 10) = (0 < sVar89) * (sVar89 < 0x100) * auVar96[4] - (0xff < sVar89);
  *(char *)((long)*in2 + 0xb) = (0 < sVar90) * (sVar90 < 0x100) * auVar96[6] - (0xff < sVar90);
  *(char *)((long)*in2 + 0xc) = (0 < sVar91) * (sVar91 < 0x100) * auVar96[8] - (0xff < sVar91);
  *(char *)((long)*in2 + 0xd) = (0 < sVar92) * (sVar92 < 0x100) * auVar96[10] - (0xff < sVar92);
  *(char *)((long)*in2 + 0xe) = (0 < sVar93) * (sVar93 < 0x100) * auVar96[0xc] - (0xff < sVar93);
  *(char *)((long)*in2 + 0xf) = (0 < sVar94) * (sVar94 < 0x100) * auVar96[0xe] - (0xff < sVar94);
  uVar108 = (ushort)bVar6;
  uVar119 = (ushort)((uint)uVar97 >> 0x18);
  uVar120 = (ushort)((uint6)uVar98 >> 0x28);
  uVar121 = (ushort)((ulong)uVar99 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar102._0_10_ >> 0x48);
  uVar123 = auVar102._10_2_ >> 8;
  uVar124 = auVar105._12_2_ >> 8;
  uVar125 = auVar135._14_2_ >> 8;
  uVar169 = (ushort)bVar62;
  uVar177 = (ushort)((uint)uVar184 >> 0x18);
  uVar178 = (ushort)((uint6)uVar185 >> 0x28);
  uVar179 = (ushort)((ulong)uVar186 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar187._0_10_ >> 0x48);
  uVar181 = auVar187._10_2_ >> 8;
  uVar182 = auVar188._12_2_ >> 8;
  uVar183 = auVar190._14_2_ >> 8;
  *(byte *)*in3 = (uVar108 != 0) * (uVar108 < 0x100) * bVar6 - (0xff < uVar108);
  *(char *)((long)*in3 + 1) = (uVar119 != 0) * (uVar119 < 0x100) * cVar12 - (0xff < uVar119);
  *(char *)((long)*in3 + 2) = (uVar120 != 0) * (uVar120 < 0x100) * cVar10 - (0xff < uVar120);
  *(char *)((long)*in3 + 3) = (uVar121 != 0) * (uVar121 < 0x100) * cVar9 - (0xff < uVar121);
  *(char *)((long)*in3 + 4) = (uVar122 != 0) * (uVar122 < 0x100) * cVar11 - (0xff < uVar122);
  *(char *)((long)*in3 + 5) = (uVar123 != 0) * (uVar123 < 0x100) * cVar59 - (0xff < uVar123);
  *(char *)((long)*in3 + 6) = (uVar124 != 0) * (uVar124 < 0x100) * cVar60 - (0xff < uVar124);
  *(char *)((long)*in3 + 7) = (uVar125 != 0) * (uVar125 < 0x100) * cVar61 - (0xff < uVar125);
  *(byte *)(*in3 + 1) = (uVar169 != 0) * (uVar169 < 0x100) * bVar62 - (0xff < uVar169);
  *(char *)((long)*in3 + 9) = (uVar177 != 0) * (uVar177 < 0x100) * cVar63 - (0xff < uVar177);
  *(char *)((long)*in3 + 10) = (uVar178 != 0) * (uVar178 < 0x100) * cVar64 - (0xff < uVar178);
  *(char *)((long)*in3 + 0xb) = (uVar179 != 0) * (uVar179 < 0x100) * cVar65 - (0xff < uVar179);
  *(char *)((long)*in3 + 0xc) = (uVar180 != 0) * (uVar180 < 0x100) * cVar66 - (0xff < uVar180);
  *(char *)((long)*in3 + 0xd) = (uVar181 != 0) * (uVar181 < 0x100) * cVar67 - (0xff < uVar181);
  *(char *)((long)*in3 + 0xe) = (uVar182 != 0) * (uVar182 < 0x100) * cVar68 - (0xff < uVar182);
  *(char *)((long)*in3 + 0xf) = (uVar183 != 0) * (uVar183 < 0x100) * cVar69 - (0xff < uVar183);
  uVar169 = (ushort)bVar70;
  uVar177 = (ushort)((uint)uVar170 >> 0x18);
  uVar178 = (ushort)((uint6)uVar171 >> 0x28);
  uVar179 = (ushort)((ulong)uVar172 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar173._0_10_ >> 0x48);
  uVar181 = auVar173._10_2_ >> 8;
  uVar182 = auVar174._12_2_ >> 8;
  uVar183 = auVar176._14_2_ >> 8;
  uVar108 = (ushort)bVar78;
  uVar119 = (ushort)((uint)uVar126 >> 0x18);
  uVar120 = (ushort)((uint6)uVar127 >> 0x28);
  uVar121 = (ushort)((ulong)uVar128 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar131._0_10_ >> 0x48);
  uVar123 = auVar131._10_2_ >> 8;
  uVar124 = auVar134._12_2_ >> 8;
  uVar125 = auVar138._14_2_ >> 8;
  *(byte *)*in4 = (uVar169 != 0) * (uVar169 < 0x100) * bVar70 - (0xff < uVar169);
  *(char *)((long)*in4 + 1) = (uVar177 != 0) * (uVar177 < 0x100) * cVar71 - (0xff < uVar177);
  *(char *)((long)*in4 + 2) = (uVar178 != 0) * (uVar178 < 0x100) * cVar72 - (0xff < uVar178);
  *(char *)((long)*in4 + 3) = (uVar179 != 0) * (uVar179 < 0x100) * cVar73 - (0xff < uVar179);
  *(char *)((long)*in4 + 4) = (uVar180 != 0) * (uVar180 < 0x100) * cVar74 - (0xff < uVar180);
  *(char *)((long)*in4 + 5) = (uVar181 != 0) * (uVar181 < 0x100) * cVar75 - (0xff < uVar181);
  *(char *)((long)*in4 + 6) = (uVar182 != 0) * (uVar182 < 0x100) * cVar76 - (0xff < uVar182);
  *(char *)((long)*in4 + 7) = (uVar183 != 0) * (uVar183 < 0x100) * cVar77 - (0xff < uVar183);
  *(byte *)(*in4 + 1) = (uVar108 != 0) * (uVar108 < 0x100) * bVar78 - (0xff < uVar108);
  *(char *)((long)*in4 + 9) = (uVar119 != 0) * (uVar119 < 0x100) * cVar21 - (0xff < uVar119);
  *(char *)((long)*in4 + 10) = (uVar120 != 0) * (uVar120 < 0x100) * cVar19 - (0xff < uVar120);
  *(char *)((long)*in4 + 0xb) = (uVar121 != 0) * (uVar121 < 0x100) * cVar18 - (0xff < uVar121);
  *(char *)((long)*in4 + 0xc) = (uVar122 != 0) * (uVar122 < 0x100) * cVar20 - (0xff < uVar122);
  *(char *)((long)*in4 + 0xd) = (uVar123 != 0) * (uVar123 < 0x100) * cVar17 - (0xff < uVar123);
  *(char *)((long)*in4 + 0xe) = (uVar124 != 0) * (uVar124 < 0x100) * cVar15 - (0xff < uVar124);
  *(char *)((long)*in4 + 0xf) = (uVar125 != 0) * (uVar125 < 0x100) * cVar16 - (0xff < uVar125);
  uVar169 = (ushort)bVar14;
  uVar177 = (ushort)((uint)uVar139 >> 0x18);
  uVar178 = (ushort)((uint6)uVar140 >> 0x28);
  uVar179 = (ushort)((ulong)uVar141 >> 0x38);
  uVar180 = (ushort)((unkuint10)auVar144._0_10_ >> 0x48);
  uVar181 = auVar144._10_2_ >> 8;
  uVar182 = auVar147._12_2_ >> 8;
  uVar183 = auVar150._14_2_ >> 8;
  uVar108 = (ushort)bVar22;
  uVar119 = (ushort)((uint)uVar109 >> 0x18);
  uVar120 = (ushort)((uint6)uVar110 >> 0x28);
  uVar121 = (ushort)((ulong)uVar111 >> 0x38);
  uVar122 = (ushort)((unkuint10)auVar114._0_10_ >> 0x48);
  uVar123 = auVar114._10_2_ >> 8;
  uVar124 = auVar117._12_2_ >> 8;
  uVar125 = auVar118._14_2_ >> 8;
  *(byte *)*in5 = (uVar169 != 0) * (uVar169 < 0x100) * bVar14 - (0xff < uVar169);
  *(char *)((long)*in5 + 1) = (uVar177 != 0) * (uVar177 < 0x100) * cVar24 - (0xff < uVar177);
  *(char *)((long)*in5 + 2) = (uVar178 != 0) * (uVar178 < 0x100) * cVar25 - (0xff < uVar178);
  *(char *)((long)*in5 + 3) = (uVar179 != 0) * (uVar179 < 0x100) * cVar26 - (0xff < uVar179);
  *(char *)((long)*in5 + 4) = (uVar180 != 0) * (uVar180 < 0x100) * cVar27 - (0xff < uVar180);
  *(char *)((long)*in5 + 5) = (uVar181 != 0) * (uVar181 < 0x100) * cVar28 - (0xff < uVar181);
  *(char *)((long)*in5 + 6) = (uVar182 != 0) * (uVar182 < 0x100) * cVar23 - (0xff < uVar182);
  *(char *)((long)*in5 + 7) = (uVar183 != 0) * (uVar183 < 0x100) * cVar29 - (0xff < uVar183);
  *(byte *)(*in5 + 1) = (uVar108 != 0) * (uVar108 < 0x100) * bVar22 - (0xff < uVar108);
  *(char *)((long)*in5 + 9) = (uVar119 != 0) * (uVar119 < 0x100) * cVar31 - (0xff < uVar119);
  *(char *)((long)*in5 + 10) = (uVar120 != 0) * (uVar120 < 0x100) * cVar37 - (0xff < uVar120);
  *(char *)((long)*in5 + 0xb) = (uVar121 != 0) * (uVar121 < 0x100) * cVar36 - (0xff < uVar121);
  *(char *)((long)*in5 + 0xc) = (uVar122 != 0) * (uVar122 < 0x100) * cVar35 - (0xff < uVar122);
  *(char *)((long)*in5 + 0xd) = (uVar123 != 0) * (uVar123 < 0x100) * cVar34 - (0xff < uVar123);
  *(char *)((long)*in5 + 0xe) = (uVar124 != 0) * (uVar124 < 0x100) * cVar13 - (0xff < uVar124);
  *(char *)((long)*in5 + 0xf) = (uVar125 != 0) * (uVar125 < 0x100) * cVar8 - (0xff < uVar125);
  lVar95 = (*in0)[1];
  *(longlong *)rgb = (*in0)[0];
  *(longlong *)(rgb + 8) = lVar95;
  lVar95 = (*in1)[1];
  *(longlong *)(rgb + 0x10) = (*in1)[0];
  *(longlong *)(rgb + 0x18) = lVar95;
  lVar95 = (*in2)[1];
  *(longlong *)(rgb + 0x20) = (*in2)[0];
  *(longlong *)(rgb + 0x28) = lVar95;
  lVar95 = (*in3)[1];
  *(longlong *)(rgb + 0x30) = (*in3)[0];
  *(longlong *)(rgb + 0x38) = lVar95;
  lVar95 = (*in4)[1];
  *(longlong *)(rgb + 0x40) = (*in4)[0];
  *(longlong *)(rgb + 0x48) = lVar95;
  lVar95 = (*in5)[1];
  *(longlong *)(rgb + 0x50) = (*in5)[0];
  *(longlong *)(rgb + 0x58) = lVar95;
  return;
}

Assistant:

static WEBP_INLINE void PlanarTo24b_SSE2(__m128i* const in0, __m128i* const in1,
                                         __m128i* const in2, __m128i* const in3,
                                         __m128i* const in4, __m128i* const in5,
                                         uint8_t* const rgb) {
  // The input is 6 registers of sixteen 8b but for the sake of explanation,
  // let's take 6 registers of four 8b values.
  // To pack, we will keep taking one every two 8b integer and move it
  // around as follows:
  // Input:
  //   r0r1r2r3 | r4r5r6r7 | g0g1g2g3 | g4g5g6g7 | b0b1b2b3 | b4b5b6b7
  // Split the 6 registers in two sets of 3 registers: the first set as the even
  // 8b bytes, the second the odd ones:
  //   r0r2r4r6 | g0g2g4g6 | b0b2b4b6 | r1r3r5r7 | g1g3g5g7 | b1b3b5b7
  // Repeat the same permutations twice more:
  //   r0r4g0g4 | b0b4r1r5 | g1g5b1b5 | r2r6g2g6 | b2b6r3r7 | g3g7b3b7
  //   r0g0b0r1 | g1b1r2g2 | b2r3g3b3 | r4g4b4r5 | g5b5r6g6 | b6r7g7b7
  VP8PlanarTo24b_SSE2(in0, in1, in2, in3, in4, in5);

  _mm_storeu_si128((__m128i*)(rgb +  0), *in0);
  _mm_storeu_si128((__m128i*)(rgb + 16), *in1);
  _mm_storeu_si128((__m128i*)(rgb + 32), *in2);
  _mm_storeu_si128((__m128i*)(rgb + 48), *in3);
  _mm_storeu_si128((__m128i*)(rgb + 64), *in4);
  _mm_storeu_si128((__m128i*)(rgb + 80), *in5);
}